

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O0

bool __thiscall LEFReader::parseLayerMaxWidth(LEFReader *this)

{
  token_t tVar1;
  double dVar2;
  invalid_argument *ia;
  double maxwidthd;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  undefined4 local_70;
  allocator<char> local_69;
  string local_68;
  undefined1 local_38 [8];
  string maxwidth;
  LEFReader *this_local;
  
  maxwidth.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  tVar1 = tokenize(this,&this->m_tokstr);
  this->m_curtok = tVar1;
  if (this->m_curtok == TOK_NUMBER) {
    std::__cxx11::string::operator=((string *)local_38,(string *)&this->m_tokstr);
    tVar1 = tokenize(this,&this->m_tokstr);
    this->m_curtok = tVar1;
    if (this->m_curtok == TOK_SEMICOL) {
      tVar1 = tokenize(this,&this->m_tokstr);
      this->m_curtok = tVar1;
      if (this->m_curtok == TOK_EOL) {
        dVar2 = std::__cxx11::stod((string *)local_38,(size_t *)0x0);
        (*this->_vptr_LEFReader[0x13])(dVar2);
        this_local._7_1_ = true;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Expected an EOL\n",(allocator<char> *)((long)&maxwidthd + 7)
                  );
        error(this,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&maxwidthd + 7));
        this_local._7_1_ = false;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Expected a semicolon in layer max width\n",&local_91);
      error(this,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Expected a number in layer max width\n",&local_69);
    error(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    this_local._7_1_ = false;
  }
  local_70 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool LEFReader::parseLayerMaxWidth()
{
    std::string maxwidth;
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number in layer max width\n");
        return false;    
    }

    maxwidth = m_tokstr;

    // expect ; 
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon in layer max width\n");
        return false;
    }

    // expect EOL
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected an EOL\n");
        return false;
    }

    double maxwidthd;
    try
    {
        maxwidthd = std::stod(maxwidth);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
    }

    onLayerMaxWidth(maxwidthd);

    return true;
}